

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_nmi_is_not_triggered_if_disabled_Test::TestBody
          (PpuTest_nmi_is_not_triggered_if_disabled_Test *this)

{
  bool bVar1;
  pointer pIVar2;
  char *message;
  char *in_R9;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  anon_class_8_1_eeed5af7 local_40;
  function<void_()> local_38;
  Register<unsigned_char> local_12;
  bool local_11;
  PpuTest_nmi_is_not_triggered_if_disabled_Test *pPStack_10;
  bool triggered;
  PpuTest_nmi_is_not_triggered_if_disabled_Test *this_local;
  
  local_11 = false;
  pPStack_10 = this;
  n_e_s::core::Register<unsigned_char>::Register(&local_12,'\0');
  (this->super_PpuTest).expected.ctrl.value_ = local_12.value_;
  (this->super_PpuTest).registers.ctrl.value_ = (this->super_PpuTest).expected.ctrl.value_;
  pIVar2 = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::operator->
                     (&(this->super_PpuTest).ppu);
  local_40.triggered = &local_11;
  std::function<void()>::
  function<(anonymous_namespace)::PpuTest_nmi_is_not_triggered_if_disabled_Test::TestBody()::__0,void>
            ((function<void()> *)&local_38,&local_40);
  (*pIVar2->_vptr_IPpu[5])(pIVar2,&local_38);
  std::function<void_()>::~function(&local_38);
  PpuTest::step_execution(&this->super_PpuTest,0x53408);
  local_61 = (bool)((local_11 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)local_60,(AssertionResult *)"triggered","true","false",in_R9);
    message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_ppu.cpp"
               ,0xaf,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST_F(PpuTest, nmi_is_not_triggered_if_disabled) {
    bool triggered = false;
    registers.ctrl = expected.ctrl = PpuCtrl(0x00);
    ppu->set_nmi_handler([&] { triggered = true; });

    // Nmi shouldn't get triggered since bit 7 in ctrl is 0.
    step_execution(kCyclesPerScanline * 1000);
    ASSERT_FALSE(triggered);
}